

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void predict(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *args)

{
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  pointer pbVar10;
  string *in;
  string infile;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  FastText fasttext;
  ifstream ifs;
  real local_2ec;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  FastText local_2b0;
  string local_238 [16];
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
  if (uVar7 - 7 < 0xfffffffffffffffd) {
    printPredictUsage();
    goto LAB_0012cd0b;
  }
  lVar9 = 1;
  local_2ec = 0.0;
  if (4 < uVar7) {
    pcVar1 = pbVar10[4]._M_dataplus._M_p;
    piVar8 = __errno_location();
    iVar5 = *piVar8;
    *piVar8 = 0;
    lVar9 = strtol(pcVar1,(char **)local_238,10);
    if (local_238[0]._M_dataplus._M_p == pcVar1) {
      lVar9 = std::__throw_invalid_argument("stoi");
    }
    iVar6 = *piVar8;
    if ((int)lVar9 != lVar9 || iVar6 == 0x22) {
      std::__throw_out_of_range("stoi");
    }
    if (iVar6 == 0) {
      *piVar8 = iVar5;
      iVar6 = iVar5;
    }
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 == 0xc0) {
      pcVar1 = pbVar10[5]._M_dataplus._M_p;
      *piVar8 = 0;
      local_2ec = strtof(pcVar1,(char **)local_238);
      if (local_238[0]._M_dataplus._M_p == pcVar1) {
        std::__throw_invalid_argument("stof");
      }
      if (*piVar8 == 0) {
LAB_0012ce03:
        *piVar8 = iVar6;
      }
      else if (*piVar8 == 0x22) {
        std::__throw_out_of_range("stof");
        goto LAB_0012ce03;
      }
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  iVar5 = std::__cxx11::string::compare((char *)(pbVar10 + 1));
  ::fasttext::FastText::FastText(&local_2b0);
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar10[2]._M_dataplus._M_p;
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_238,pcVar2,pcVar2 + pbVar10[2]._M_string_length);
  ::fasttext::FastText::loadModel(&local_2b0,local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p);
  }
  std::ifstream::ifstream(local_238);
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_2e8[0] = local_2d8;
  pcVar2 = pbVar10[3]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e8,pcVar2,pcVar2 + pbVar10[3]._M_string_length);
  iVar6 = std::__cxx11::string::compare((char *)local_2e8);
  if (iVar6 == 0) {
    in = (string *)&std::cin;
  }
  else {
    in = local_238;
    std::ifstream::open((string *)in,(_Ios_Openmode)local_2e8);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Input file cannot be opened!",0x1c);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0012cd0b:
      exit(1);
    }
  }
  local_2c8.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar3 = ::fasttext::FastText::predictLine
                      (&local_2b0,(istream *)in,&local_2c8,(int32_t)lVar9,local_2ec);
    if (!bVar3) break;
    printPredictions(&local_2c8,iVar5 == 0,false);
  }
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::ifstream::close();
  }
  exit(0);
}

Assistant:

void predict(const std::vector<std::string>& args) {
  if (args.size() < 4 || args.size() > 6) {
    printPredictUsage();
    exit(EXIT_FAILURE);
  }
  int32_t k = 1;
  real threshold = 0.0;
  if (args.size() > 4) {
    k = std::stoi(args[4]);
    if (args.size() == 6) {
      threshold = std::stof(args[5]);
    }
  }

  bool printProb = args[1] == "predict-prob";
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));

  std::ifstream ifs;
  std::string infile(args[3]);
  bool inputIsStdIn = infile == "-";
  if (!inputIsStdIn) {
    ifs.open(infile);
    if (!inputIsStdIn && !ifs.is_open()) {
      std::cerr << "Input file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
  }
  std::istream& in = inputIsStdIn ? std::cin : ifs;
  std::vector<std::pair<real, std::string>> predictions;
  while (fasttext.predictLine(in, predictions, k, threshold)) {
    printPredictions(predictions, printProb, false);
  }
  if (ifs.is_open()) {
    ifs.close();
  }

  exit(0);
}